

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::Perform
          (Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this,
          ArgumentTuple *args)

{
  ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *pAVar1;
  IDType IVar2;
  allocator<char> local_41;
  string local_40;
  
  pAVar1 = (this->impl_).value_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_41);
  internal::Assert(pAVar1 != (ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                              *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/../thirdparty/gmock/gmock.h"
                   ,0x4c3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar1 = (this->impl_).value_;
  IVar2 = (*pAVar1->_vptr_ActionInterface[2])(pAVar1,args);
  return (Result)IVar2;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }